

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

void __thiscall
cmOSXBundleGenerator::CreateCFBundle
          (cmOSXBundleGenerator *this,string *targetName,string *root,string *config)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string plist;
  string out;
  string name;
  string local_110;
  string *local_f0;
  string *local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  char *local_68;
  size_type local_60;
  undefined1 *puStack_58;
  undefined1 local_50 [32];
  
  bVar3 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar3) {
    pcVar1 = (root->_M_dataplus)._M_p;
    pcVar2 = (pointer)root->_M_string_length;
    local_60 = 1;
    local_50[0] = 0x2f;
    local_f0 = targetName;
    local_e8 = config;
    puStack_58 = local_50;
    cmGeneratorTarget::GetCFBundleDirectory(&local_110,this->GT,config,FullLevel);
    local_a0.field_2._M_allocated_capacity = local_60;
    local_a0.field_2._8_8_ = puStack_58;
    local_80 = local_110._M_string_length;
    local_78 = local_110._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = (iterator)&local_a0;
    local_a0._M_dataplus._M_p = pcVar2;
    local_a0._M_string_length = (size_type)pcVar1;
    cmCatViews_abi_cxx11_(&local_c0,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::MakeDirectory(&local_c0,(mode_t *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_c0);
    pcVar1 = (root->_M_dataplus)._M_p;
    pcVar2 = (pointer)root->_M_string_length;
    local_60 = 1;
    local_50[0] = 0x2f;
    puStack_58 = local_50;
    cmGeneratorTarget::GetCFBundleDirectory(&local_e0,this->GT,local_e8,ContentLevel);
    local_a0.field_2._M_allocated_capacity = local_60;
    local_a0.field_2._8_8_ = puStack_58;
    local_80 = local_e0._M_string_length;
    local_78 = local_e0._M_dataplus._M_p;
    local_70 = 0xb;
    local_68 = "/Info.plist";
    views_00._M_len = 4;
    views_00._M_array = (iterator)&local_a0;
    local_a0._M_dataplus._M_p = pcVar2;
    local_a0._M_string_length = (size_type)pcVar1;
    cmCatViews_abi_cxx11_(&local_110,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetFilenameName(&local_a0,local_f0);
    cmLocalGenerator::GenerateAppleInfoPList(this->LocalGenerator,this->GT,&local_a0,&local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateCFBundle(const std::string& targetName,
                                          const std::string& root,
                                          const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, name, plist);
  this->Makefile->AddCMakeOutputFile(plist);
}